

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  uint uVar1;
  ImGuiTextRange *pIVar2;
  char *needle_end;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  byte unaff_BPL;
  long lVar6;
  ulong uVar7;
  char *haystack;
  bool bVar8;
  
  if ((this->Filters).Size == 0) {
    unaff_BPL = 1;
  }
  else {
    haystack = "";
    if (text != (char *)0x0) {
      haystack = text;
    }
    uVar1 = (this->Filters).Size;
    uVar4 = (ulong)uVar1;
    bVar8 = uVar1 == 0;
    if (!bVar8) {
      lVar6 = 8;
      uVar7 = 0;
      do {
        if ((long)(int)uVar4 <= (long)uVar7) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x605,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar2 = (this->Filters).Data;
        pcVar5 = *(char **)((long)pIVar2 + lVar6 + -8);
        needle_end = *(char **)((long)&pIVar2->b + lVar6);
        if (pcVar5 == needle_end) {
          bVar3 = false;
        }
        else if (*pcVar5 == '-') {
          pcVar5 = ImStristr(haystack,text_end,pcVar5 + 1,needle_end);
          if (pcVar5 == (char *)0x0) {
LAB_001ff1f8:
            bVar3 = false;
          }
          else {
            bVar3 = true;
            unaff_BPL = 0;
          }
        }
        else {
          pcVar5 = ImStristr(haystack,text_end,pcVar5,needle_end);
          if (pcVar5 == (char *)0x0) goto LAB_001ff1f8;
          unaff_BPL = 1;
          bVar3 = true;
        }
        if (bVar3) break;
        uVar7 = uVar7 + 1;
        uVar4 = (ulong)(uint)(this->Filters).Size;
        lVar6 = lVar6 + 0x10;
        bVar8 = uVar7 == uVar4;
      } while (!bVar8);
    }
    if (bVar8) {
      unaff_BPL = this->CountGrep == 0;
    }
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ImGuiTextFilter::PassFilter(const char* text, const char* text_end) const
{
    if (Filters.empty())
        return true;

    if (text == NULL)
        text = "";

    for (int i = 0; i != Filters.Size; i++)
    {
        const ImGuiTextRange& f = Filters[i];
        if (f.empty())
            continue;
        if (f.b[0] == '-')
        {
            // Subtract
            if (ImStristr(text, text_end, f.b + 1, f.e) != NULL)
                return false;
        }
        else
        {
            // Grep
            if (ImStristr(text, text_end, f.b, f.e) != NULL)
                return true;
        }
    }

    // Implicit * grep
    if (CountGrep == 0)
        return true;

    return false;
}